

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bssrdf.cpp
# Opt level: O2

void __thiscall pbrt::ComputeBeamDiffusionBSSRDF(pbrt *this,Float g,Float eta,BSSRDFTable *t)

{
  undefined8 *puVar1;
  undefined1 auVar2 [16];
  int i;
  ulong uVar3;
  int i_1;
  ulong uVar4;
  int iVar5;
  float fVar6;
  undefined4 in_XMM2_Da;
  undefined1 in_register_00001284 [12];
  Float eta_local;
  Float g_local;
  BSSRDFTable *t_local;
  _Any_data local_48;
  code *pcStack_38;
  code *pcStack_30;
  
  puVar1 = *(undefined8 **)(this + 0x28);
  *puVar1 = 0x3b23d70a00000000;
  uVar4 = *(ulong *)(this + 0x38);
  for (uVar3 = 2; uVar3 < uVar4; uVar3 = uVar3 + 1) {
    *(float *)((long)puVar1 + uVar3 * 4) = *(float *)((long)puVar1 + uVar3 * 4 + -4) * 1.2;
  }
  iVar5 = 0;
  eta_local = eta;
  g_local = g;
  t_local = (BSSRDFTable *)this;
  for (uVar4 = 0; uVar3 = *(ulong *)(this + 0x18), uVar4 < uVar3; uVar4 = uVar4 + 1) {
    auVar2._4_12_ = in_register_00001284;
    auVar2._0_4_ = in_XMM2_Da;
    auVar2 = vcvtusi2ss_avx512f(auVar2,uVar3 - 1);
    fVar6 = FastExp((float)iVar5 / auVar2._0_4_);
    iVar5 = iVar5 + -8;
    *(float *)(*(long *)(this + 8) + uVar4 * 4) = (1.0 - fVar6) / 0.99966455;
  }
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  pcStack_38 = (code *)0x0;
  pcStack_30 = (code *)0x0;
  local_48._M_unused._M_object = operator_new(0x18);
  *(BSSRDFTable ***)local_48._M_unused._0_8_ = &t_local;
  *(Float **)((long)local_48._M_unused._0_8_ + 8) = &g_local;
  *(Float **)((long)local_48._M_unused._0_8_ + 0x10) = &eta_local;
  pcStack_30 = std::
               _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/bssrdf.cpp:111:42)>
               ::_M_invoke;
  pcStack_38 = std::
               _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/bssrdf.cpp:111:42)>
               ::_M_manager;
  ParallelFor(0,uVar3,(function<void_(long)> *)&local_48);
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  return;
}

Assistant:

void ComputeBeamDiffusionBSSRDF(Float g, Float eta, BSSRDFTable *t) {
    // Choose radius values of the diffusion profile discretization
    t->radiusSamples[0] = 0;
    t->radiusSamples[1] = 2.5e-3f;
    for (int i = 2; i < t->radiusSamples.size(); ++i)
        t->radiusSamples[i] = t->radiusSamples[i - 1] * 1.2f;

    // Choose albedo values of the diffusion profile discretization
    for (int i = 0; i < t->rhoSamples.size(); ++i)
        t->rhoSamples[i] =
            (1 - FastExp(-8 * i / (Float)(t->rhoSamples.size() - 1))) / (1 - FastExp(-8));

    ParallelFor(0, t->rhoSamples.size(), [&](int i) {
        // Compute the diffusion profile for the _i_th albedo sample
        // Compute scattering profile for chosen albedo $\rho$
        size_t nSamples = t->radiusSamples.size();
        for (int j = 0; j < nSamples; ++j) {
            Float rho = t->rhoSamples[i], r = t->radiusSamples[j];
            t->profile[i * nSamples + j] = 2 * Pi * r *
                                           (BeamDiffusionSS(rho, 1 - rho, g, eta, r) +
                                            BeamDiffusionMS(rho, 1 - rho, g, eta, r));
        }

        // Compute effective albedo $\rho_{\roman{eff}}$ and CDF for importance sampling
        t->rhoEff[i] = IntegrateCatmullRom(
            t->radiusSamples,
            pstd::span<const Float>(&t->profile[i * nSamples], nSamples),
            pstd::span<Float>(&t->profileCDF[i * nSamples], nSamples));
    });
}